

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

int yaml_document_initialize
              (yaml_document_t *document,yaml_version_directive_t *version_directive,
              yaml_tag_directive_t *tag_directives_start,yaml_tag_directive_t *tag_directives_end,
              int start_implicit,int end_implicit)

{
  yaml_char_t *__ptr;
  size_t size;
  bool bVar1;
  int iVar2;
  yaml_node_t *__ptr_00;
  yaml_tag_directive_t *pyVar3;
  size_t sVar4;
  yaml_char_t *pyVar5;
  yaml_char_t *pyVar6;
  yaml_tag_directive_t *pyVar7;
  yaml_tag_directive_t *ptr;
  yaml_tag_directive_t *pyVar8;
  yaml_mark_t mark;
  yaml_version_directive_t *local_60;
  
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x423,
                  "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                 );
  }
  if ((tag_directives_start != tag_directives_end) &&
     (tag_directives_start == (yaml_tag_directive_t *)0x0 ||
      tag_directives_end == (yaml_tag_directive_t *)0x0)) {
    __assert_fail("(tag_directives_start && tag_directives_end) || (tag_directives_start == tag_directives_end)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x425,
                  "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                 );
  }
  __ptr_00 = (yaml_node_t *)malloc(0x600);
  if (__ptr_00 == (yaml_node_t *)0x0) {
LAB_00104165:
    pyVar7 = (yaml_tag_directive_t *)0x0;
    pyVar3 = (yaml_tag_directive_t *)0x0;
    local_60 = (yaml_version_directive_t *)0x0;
    pyVar5 = (yaml_char_t *)0x0;
    pyVar6 = (yaml_char_t *)0x0;
LAB_0010437c:
    if (__ptr_00 != (yaml_node_t *)0x0) {
      free(__ptr_00);
    }
    if (local_60 != (yaml_version_directive_t *)0x0) {
      free(local_60);
    }
    for (; pyVar7 != pyVar3; pyVar3 = pyVar3 + -1) {
      __ptr = pyVar3[-1].prefix;
      if (pyVar3[-1].handle != (yaml_char_t *)0x0) {
        free(pyVar3[-1].handle);
      }
      if (__ptr != (yaml_char_t *)0x0) {
        free(__ptr);
      }
    }
    if (pyVar7 != (yaml_tag_directive_t *)0x0) {
      free(pyVar7);
    }
    if (pyVar5 != (yaml_char_t *)0x0) {
      free(pyVar5);
    }
    iVar2 = 0;
    if (pyVar6 != (yaml_char_t *)0x0) {
      free(pyVar6);
      iVar2 = 0;
    }
  }
  else {
    if (version_directive == (yaml_version_directive_t *)0x0) {
      local_60 = (yaml_version_directive_t *)0x0;
    }
    else {
      local_60 = (yaml_version_directive_t *)malloc(8);
      if (local_60 == (yaml_version_directive_t *)0x0) goto LAB_00104165;
      local_60->major = version_directive->major;
      local_60->minor = version_directive->minor;
    }
    if (tag_directives_start == tag_directives_end) {
      pyVar7 = (yaml_tag_directive_t *)0x0;
      pyVar3 = (yaml_tag_directive_t *)0x0;
    }
    else {
      pyVar3 = (yaml_tag_directive_t *)malloc(0x100);
      pyVar7 = pyVar3;
      if (pyVar3 == (yaml_tag_directive_t *)0x0) {
        pyVar3 = (yaml_tag_directive_t *)0x0;
LAB_001042ca:
        pyVar5 = (yaml_char_t *)0x0;
        pyVar6 = (yaml_char_t *)0x0;
LAB_001042cf:
        bVar1 = false;
      }
      else {
        if (tag_directives_start != tag_directives_end) {
          pyVar8 = pyVar3 + 0x10;
          ptr = pyVar3;
          do {
            pyVar5 = tag_directives_start->handle;
            if (pyVar5 == (yaml_char_t *)0x0) {
              __assert_fail("tag_directive->handle",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                            ,0x437,
                            "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                           );
            }
            pyVar6 = tag_directives_start->prefix;
            if (pyVar6 == (yaml_char_t *)0x0) {
              __assert_fail("tag_directive->prefix",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                            ,0x438,
                            "int yaml_document_initialize(yaml_document_t *, yaml_version_directive_t *, yaml_tag_directive_t *, yaml_tag_directive_t *, int, int)"
                           );
            }
            sVar4 = strlen((char *)pyVar5);
            iVar2 = yaml_check_utf8(pyVar5,sVar4);
            pyVar7 = ptr;
            if (iVar2 == 0) goto LAB_001042ca;
            sVar4 = strlen((char *)pyVar6);
            iVar2 = yaml_check_utf8(pyVar6,sVar4);
            if (iVar2 == 0) goto LAB_001042ca;
            pyVar5 = (yaml_char_t *)strdup((char *)pyVar5);
            pyVar6 = (yaml_char_t *)strdup((char *)pyVar6);
            if ((pyVar5 == (yaml_char_t *)0x0) || (pyVar6 == (yaml_char_t *)0x0)) goto LAB_001042cf;
            if (pyVar3 == pyVar8) {
              bVar1 = true;
              if ((long)pyVar8 - (long)ptr < 0x3fffffff) {
                size = ((long)pyVar8 - (long)ptr) * 2;
                pyVar7 = (yaml_tag_directive_t *)yaml_realloc(ptr,size);
                if (pyVar7 == (yaml_tag_directive_t *)0x0) {
                  bVar1 = true;
                  pyVar7 = ptr;
                }
                else {
                  pyVar3 = (yaml_tag_directive_t *)(((long)pyVar3 - (long)ptr) + (long)pyVar7);
                  pyVar8 = (yaml_tag_directive_t *)(size + (long)pyVar7);
                  bVar1 = false;
                }
              }
              if (bVar1) goto LAB_001042cf;
            }
            pyVar3->handle = pyVar5;
            pyVar3->prefix = pyVar6;
            pyVar3 = pyVar3 + 1;
            tag_directives_start = tag_directives_start + 1;
            ptr = pyVar7;
          } while (tag_directives_start != tag_directives_end);
        }
        pyVar5 = (yaml_char_t *)0x0;
        pyVar6 = (yaml_char_t *)0x0;
        bVar1 = true;
      }
      if (!bVar1) goto LAB_0010437c;
    }
    (document->nodes).start = (yaml_node_t *)0x0;
    (document->nodes).end = (yaml_node_t *)0x0;
    (document->nodes).top = (yaml_node_t *)0x0;
    document->version_directive = (yaml_version_directive_t *)0x0;
    (document->tag_directives).start = (yaml_tag_directive_t *)0x0;
    (document->tag_directives).end = (yaml_tag_directive_t *)0x0;
    document->start_implicit = 0;
    document->end_implicit = 0;
    (document->start_mark).index = 0;
    (document->end_mark).index = 0;
    (document->end_mark).line = 0;
    (document->start_mark).line = 0;
    (document->start_mark).column = 0;
    (document->end_mark).column = 0;
    (document->nodes).start = __ptr_00;
    (document->nodes).end = __ptr_00 + 0x10;
    (document->nodes).top = __ptr_00;
    document->version_directive = local_60;
    (document->tag_directives).start = pyVar7;
    (document->tag_directives).end = pyVar3;
    document->start_implicit = start_implicit;
    document->end_implicit = end_implicit;
    (document->start_mark).index = 0;
    (document->start_mark).line = 0;
    (document->start_mark).column = 0;
    (document->end_mark).index = 0;
    (document->end_mark).line = 0;
    (document->end_mark).column = 0;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

YAML_DECLARE(int)
yaml_document_initialize(yaml_document_t *document,
        yaml_version_directive_t *version_directive,
        yaml_tag_directive_t *tag_directives_start,
        yaml_tag_directive_t *tag_directives_end,
        int start_implicit, int end_implicit)
{
    struct {
        yaml_error_type_t error;
    } context;
    struct {
        yaml_node_t *start;
        yaml_node_t *end;
        yaml_node_t *top;
    } nodes = { NULL, NULL, NULL };
    yaml_version_directive_t *version_directive_copy = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
        yaml_tag_directive_t *top;
    } tag_directives_copy = { NULL, NULL, NULL };
    yaml_tag_directive_t value = { NULL, NULL };
    yaml_mark_t mark = { 0, 0, 0 };

    assert(document);       /* Non-NULL document object is expected. */
    assert((tag_directives_start && tag_directives_end) ||
            (tag_directives_start == tag_directives_end));
                            /* Valid tag directives are expected. */

    if (!STACK_INIT(&context, nodes, yaml_node_t*)) goto error;

    if (version_directive) {
        version_directive_copy = YAML_MALLOC_STATIC(yaml_version_directive_t);
        if (!version_directive_copy) goto error;
        version_directive_copy->major = version_directive->major;
        version_directive_copy->minor = version_directive->minor;
    }

    if (tag_directives_start != tag_directives_end) {
        yaml_tag_directive_t *tag_directive;
        if (!STACK_INIT(&context, tag_directives_copy, yaml_tag_directive_t*))
            goto error;
        for (tag_directive = tag_directives_start;
                tag_directive != tag_directives_end; tag_directive ++) {
            assert(tag_directive->handle);
            assert(tag_directive->prefix);
            if (!yaml_check_utf8(tag_directive->handle,
                        strlen((char *)tag_directive->handle)))
                goto error;
            if (!yaml_check_utf8(tag_directive->prefix,
                        strlen((char *)tag_directive->prefix)))
                goto error;
            value.handle = yaml_strdup(tag_directive->handle);
            value.prefix = yaml_strdup(tag_directive->prefix);
            if (!value.handle || !value.prefix) goto error;
            if (!PUSH(&context, tag_directives_copy, value))
                goto error;
            value.handle = NULL;
            value.prefix = NULL;
        }
    }

    DOCUMENT_INIT(*document, nodes.start, nodes.end, version_directive_copy,
            tag_directives_copy.start, tag_directives_copy.top,
            start_implicit, end_implicit, mark, mark);

    return 1;

error:
    STACK_DEL(&context, nodes);
    yaml_free(version_directive_copy);
    while (!STACK_EMPTY(&context, tag_directives_copy)) {
        yaml_tag_directive_t value = POP(&context, tag_directives_copy);
        yaml_free(value.handle);
        yaml_free(value.prefix);
    }
    STACK_DEL(&context, tag_directives_copy);
    yaml_free(value.handle);
    yaml_free(value.prefix);

    return 0;
}